

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

void __thiscall LongReadsMapper::read_read_paths(LongReadsMapper *this,string *filename)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  vector<long,_std::allocator<long>_> *v;
  vector<long,_std::allocator<long>_> *this_00;
  uint64_t count;
  uint64_t count_1;
  ifstream ifs;
  size_type local_238;
  size_type local_230;
  char local_228 [520];
  
  std::ifstream::ifstream(local_228,(string *)filename,_S_bin);
  std::istream::read(local_228,(long)&local_238);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(&this->read_paths,local_238);
  if (local_238 != 0) {
    this_00 = (this->read_paths).
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->read_paths).
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pvVar1) {
      do {
        std::istream::read(local_228,(long)&local_230);
        std::vector<long,_std::allocator<long>_>::resize(this_00,local_230);
        if (local_230 != 0) {
          std::istream::read(local_228,
                             (long)(this_00->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pvVar1);
    }
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void LongReadsMapper::read_read_paths(std::string filename) {
    std::ifstream ifs(filename, std::ios_base::binary);
    sdglib::read_flat_vectorvector(ifs,read_paths);
}